

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

void __thiscall sector_t::GetSpecial(sector_t *this,secspecial_t *spec)

{
  int iVar1;
  short sVar2;
  
  spec->special = this->special;
  iVar1 = this->damageamount;
  spec->damagetype = (FName)(this->damagetype).super_FName;
  spec->damageamount = iVar1;
  sVar2 = this->leakydamage;
  spec->damageinterval = this->damageinterval;
  spec->leakydamage = sVar2;
  spec->Flags = this->Flags & 0x7b0;
  return;
}

Assistant:

void sector_t::GetSpecial(secspecial_t *spec)
{
	spec->special = special;
	spec->damageamount = damageamount;
	spec->damagetype = damagetype;
	spec->damageinterval = damageinterval;
	spec->leakydamage = leakydamage;
	spec->Flags = Flags & SECF_SPECIALFLAGS;
}